

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O0

Target * __thiscall
llbuild::buildsystem::BuildDescription::addTarget
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
          *value)

{
  pointer pTVar1;
  target_set *this_00;
  pointer this_01;
  unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  *this_02;
  StringRef Key;
  Target *result;
  unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  *value_local;
  BuildDescription *this_local;
  
  pTVar1 = std::
           unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
           ::get(value);
  this_00 = getTargets(this);
  this_01 = std::
            unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
            ::operator->(value);
  Key = Target::getName(this_01);
  this_02 = llvm::
            StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
            ::operator[](this_00,Key);
  std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  ::operator=(this_02,value);
  return pTVar1;
}

Assistant:

Target& BuildDescription::addTarget(std::unique_ptr<Target> value) {
  auto& result = *value.get();
  getTargets()[value->getName()] = std::move(value);
  return result;
}